

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_group.hpp
# Opt level: O3

void __thiscall
oqpi::
task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::activeWait(task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
             *this)

{
  code *pcVar1;
  eAssertResult eVar2;
  __pid_t _Var3;
  void *in_RSI;
  
  if (!activeWait::always_ignore) {
    in_RSI = (void *)0x4d;
    eVar2 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task_group.hpp"
                            ,0x4d,"(false)","Not supported, fall back to wait");
    if (eVar2 == eAR_AlwaysIgnore) {
      activeWait::always_ignore = true;
    }
    else if (eVar2 == eAR_Retry) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  _Var3 = posix_semaphore_wrapper::wait
                    ((posix_semaphore_wrapper *)
                     &this->
                      super_notifier<(oqpi::task_type)1,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
                     ,in_RSI);
  if ((char)_Var3 != '\0') {
    posix_semaphore_wrapper::post
              ((posix_semaphore_wrapper *)
               &this->
                super_notifier<(oqpi::task_type)1,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
              );
    return;
  }
  return;
}

Assistant:

virtual void activeWait() override
        {
            oqpi_checkf(false, "Not supported, fall back to wait");
            wait();
        }